

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

ByteData *
cfd::core::SignatureUtil::CalculateEcSignature
          (ByteData *__return_storage_ptr__,ByteData256 *signature_hash,Privkey *private_key,
          bool has_grind_r)

{
  uchar *bytes_out;
  CfdException *this;
  value_type_conflict *__val;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sighash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_data;
  int local_94;
  string local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  bytes_out = (uchar *)operator_new(0x40);
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = bytes_out + 0x40;
  bytes_out[0] = '\0';
  bytes_out[1] = '\0';
  bytes_out[2] = '\0';
  bytes_out[3] = '\0';
  bytes_out[4] = '\0';
  bytes_out[5] = '\0';
  bytes_out[6] = '\0';
  bytes_out[7] = '\0';
  bytes_out[8] = '\0';
  bytes_out[9] = '\0';
  bytes_out[10] = '\0';
  bytes_out[0xb] = '\0';
  bytes_out[0xc] = '\0';
  bytes_out[0xd] = '\0';
  bytes_out[0xe] = '\0';
  bytes_out[0xf] = '\0';
  bytes_out[0x10] = '\0';
  bytes_out[0x11] = '\0';
  bytes_out[0x12] = '\0';
  bytes_out[0x13] = '\0';
  bytes_out[0x14] = '\0';
  bytes_out[0x15] = '\0';
  bytes_out[0x16] = '\0';
  bytes_out[0x17] = '\0';
  bytes_out[0x18] = '\0';
  bytes_out[0x19] = '\0';
  bytes_out[0x1a] = '\0';
  bytes_out[0x1b] = '\0';
  bytes_out[0x1c] = '\0';
  bytes_out[0x1d] = '\0';
  bytes_out[0x1e] = '\0';
  bytes_out[0x1f] = '\0';
  bytes_out[0x20] = '\0';
  bytes_out[0x21] = '\0';
  bytes_out[0x22] = '\0';
  bytes_out[0x23] = '\0';
  bytes_out[0x24] = '\0';
  bytes_out[0x25] = '\0';
  bytes_out[0x26] = '\0';
  bytes_out[0x27] = '\0';
  bytes_out[0x28] = '\0';
  bytes_out[0x29] = '\0';
  bytes_out[0x2a] = '\0';
  bytes_out[0x2b] = '\0';
  bytes_out[0x2c] = '\0';
  bytes_out[0x2d] = '\0';
  bytes_out[0x2e] = '\0';
  bytes_out[0x2f] = '\0';
  bytes_out[0x30] = '\0';
  bytes_out[0x31] = '\0';
  bytes_out[0x32] = '\0';
  bytes_out[0x33] = '\0';
  bytes_out[0x34] = '\0';
  bytes_out[0x35] = '\0';
  bytes_out[0x36] = '\0';
  bytes_out[0x37] = '\0';
  bytes_out[0x38] = '\0';
  bytes_out[0x39] = '\0';
  bytes_out[0x3a] = '\0';
  bytes_out[0x3b] = '\0';
  bytes_out[0x3c] = '\0';
  bytes_out[0x3d] = '\0';
  bytes_out[0x3e] = '\0';
  bytes_out[0x3f] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = bytes_out;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Privkey::GetData((ByteData *)&local_90,private_key);
  ByteData::GetBytes(&local_40,(ByteData *)&local_90);
  if (local_90._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  ByteData256::GetBytes(&local_58,signature_hash);
  local_94 = wally_ec_sig_from_bytes
                       (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,(uint)has_grind_r * 4 + 1,
                        bytes_out,0x40);
  if (local_94 == 0) {
    ByteData::ByteData(__return_storage_ptr__,&local_70);
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_90._M_dataplus._M_p = "cfdcore_transaction_common.cpp";
  local_90._M_string_length._0_4_ = 0xdf;
  local_90.field_2._M_allocated_capacity = (long)"CfdCalculateEcSignature" + 3;
  logger::log<int&>((CfdSourceLocation *)&local_90,kCfdLogLevelWarning,
                    "wally_ec_sig_from_bytes NG[{}] ",&local_94);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"ec signature calculation error.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,&local_90);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData SignatureUtil::CalculateEcSignature(
    const ByteData256 &signature_hash, const Privkey &private_key,
    bool has_grind_r) {
  std::vector<uint8_t> buffer(EC_SIGNATURE_LEN);
  std::vector<uint8_t> privkey_data = private_key.GetData().GetBytes();
  std::vector<uint8_t> sighash = signature_hash.GetBytes();
  uint32_t flag = EC_FLAG_ECDSA;
  if (has_grind_r) {
    flag |= EC_FLAG_GRIND_R;
  }
  int ret = wally_ec_sig_from_bytes(
      privkey_data.data(), privkey_data.size(), sighash.data(), sighash.size(),
      flag, buffer.data(), buffer.size());

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_from_bytes NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "ec signature calculation error.");
  }
  return ByteData(buffer);
}